

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidget::sharedPainter(QWidget *this)

{
  sharedPainter((QWidget *)&this[-1].field_0x18);
  return;
}

Assistant:

QPainter *QWidget::sharedPainter() const
{
    // Someone sent a paint event directly to the widget
    if (!d_func()->redirectDev)
        return nullptr;

    QPainter *sp = d_func()->sharedPainter();
    if (!sp || !sp->isActive())
        return nullptr;

    if (sp->paintEngine()->paintDevice() != d_func()->redirectDev)
        return nullptr;

    return sp;
}